

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QColorDialog::setOption(QColorDialog *this,ColorDialogOption option,bool on)

{
  bool bVar1;
  byte in_DL;
  QFlags<QColorDialog::ColorDialogOption> *in_RDI;
  long in_FS_OFFSET;
  QColorDialog *in_stack_00000008;
  ColorDialogOptions previousOptions;
  ColorDialogOption in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  QFlagsStorageHelper<QColorDialog::ColorDialogOption,_4> local_10;
  QFlagsStorageHelper<QColorDialog::ColorDialogOption,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c.super_QFlagsStorage<QColorDialog::ColorDialogOption>.i =
       (QFlagsStorage<QColorDialog::ColorDialogOption>)0xaaaaaaaa;
  local_c.super_QFlagsStorage<QColorDialog::ColorDialogOption>.i =
       (QFlagsStorage<QColorDialog::ColorDialogOption>)
       options((QColorDialog *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  local_10.super_QFlagsStorage<QColorDialog::ColorDialogOption>.i =
       (QFlagsStorage<QColorDialog::ColorDialogOption>)
       QFlags<QColorDialog::ColorDialogOption>::operator&(in_RDI,in_stack_ffffffffffffffcc);
  bVar1 = QFlags<QColorDialog::ColorDialogOption>::operator!
                    ((QFlags<QColorDialog::ColorDialogOption> *)&local_10);
  if (bVar1 != (bool)((in_DL & 1 ^ 0xff) & 1)) {
    QFlags<QColorDialog::ColorDialogOption>::operator^(in_RDI,in_stack_ffffffffffffffcc);
    setOptions(in_stack_00000008,previousOptions);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorDialog::setOption(ColorDialogOption option, bool on)
{
    const QColorDialog::ColorDialogOptions previousOptions = options();
    if (!(previousOptions & option) != !on)
        setOptions(previousOptions ^ option);
}